

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O1

_Bool find_rotzoom(Correspondence *points,int *indices,int num_indices,double *params)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  bool bVar6;
  undefined1 *puVar7;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  ulong uVar13;
  double *pdVar14;
  double *pdVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  int i;
  long lVar18;
  ulong uVar19;
  double *pdVar20;
  long lVar21;
  ulong uVar22;
  double dVar23;
  double local_c8 [8];
  double dStack_88;
  double y [4];
  
  puVar16 = &stack0xfffffffffffffff8;
  dStack_88 = 0.0;
  y[0] = 0.0;
  y[1] = 0.0;
  y[2] = 0.0;
  y[3] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  if (0 < num_indices) {
    uVar13 = 0;
    do {
      iVar5 = indices[uVar13];
      dVar23 = points[iVar5].rx;
      dVar1 = points[iVar5].ry;
      local_c8[4] = 1.0;
      local_c8[5] = 0.0;
      dVar4 = points[iVar5].x;
      local_c8[7] = points[iVar5].y;
      local_c8[6] = dVar4;
      lVar18 = 0;
      pdVar14 = local_c8 + 8;
      do {
        dVar2 = local_c8[lVar18 + 4];
        lVar21 = 0;
        do {
          dVar8 = local_c8[lVar21 + 5];
          dVar3 = (pdVar14 + lVar21)[1];
          pdVar14[lVar21] = local_c8[lVar21 + 4] * dVar2 + pdVar14[lVar21];
          (pdVar14 + lVar21)[1] = dVar8 * dVar2 + dVar3;
          lVar21 = lVar21 + 2;
        } while (lVar21 != 4);
        lVar18 = lVar18 + 1;
        pdVar14 = pdVar14 + 4;
      } while (lVar18 != 4);
      lVar18 = 0;
      do {
        local_c8[lVar18] = local_c8[lVar18 + 4] * dVar23 + local_c8[lVar18];
        local_c8[lVar18 + 1] = local_c8[lVar18 + 5] * dVar23 + local_c8[lVar18 + 1];
        lVar18 = lVar18 + 2;
      } while (lVar18 != 4);
      local_c8[4] = 0.0;
      local_c8[5] = 1.0;
      local_c8[6] = local_c8[7];
      local_c8[7] = -dVar4;
      lVar18 = 0;
      pdVar14 = local_c8 + 8;
      do {
        dVar23 = local_c8[lVar18 + 4];
        lVar21 = 0;
        do {
          dVar2 = local_c8[lVar21 + 5];
          dVar4 = (pdVar14 + lVar21)[1];
          pdVar14[lVar21] = local_c8[lVar21 + 4] * dVar23 + pdVar14[lVar21];
          (pdVar14 + lVar21)[1] = dVar2 * dVar23 + dVar4;
          lVar21 = lVar21 + 2;
        } while (lVar21 != 4);
        lVar18 = lVar18 + 1;
        pdVar14 = pdVar14 + 4;
      } while (lVar18 != 4);
      lVar18 = 0;
      do {
        local_c8[lVar18] = local_c8[lVar18 + 4] * dVar1 + local_c8[lVar18];
        local_c8[lVar18 + 1] = local_c8[lVar18 + 5] * dVar1 + local_c8[lVar18 + 1];
        lVar18 = lVar18 + 2;
      } while (lVar18 != 4);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)num_indices);
  }
  pdVar14 = local_c8 + 8;
  pdVar15 = y + 3;
  uVar13 = 0;
  do {
    uVar22 = 3;
    puVar7 = &stack0xfffffffffffffff8;
    do {
      puVar17 = puVar7 + -0x20;
      uVar19 = uVar22 - 1;
      if (ABS(y[uVar13 + uVar19 * 4 + -1]) < ABS(y[uVar13 + uVar22 * 4 + -1])) {
        lVar18 = -4;
        do {
          uVar9 = *(undefined8 *)((long)(puVar17 + lVar18 * 8) + 8);
          uVar10 = *(undefined8 *)(puVar7 + lVar18 * 8);
          uVar11 = *(undefined8 *)((long)(puVar7 + lVar18 * 8) + 8);
          *(undefined8 *)(puVar7 + lVar18 * 8) = *(undefined8 *)(puVar17 + lVar18 * 8);
          *(undefined8 *)((long)(puVar7 + lVar18 * 8) + 8) = uVar9;
          *(undefined8 *)(puVar17 + lVar18 * 8) = uVar10;
          *(undefined8 *)((long)(puVar17 + lVar18 * 8) + 8) = uVar11;
          lVar18 = lVar18 + 2;
        } while (lVar18 != 0);
        dVar23 = local_c8[uVar19];
        local_c8[uVar19] = local_c8[uVar22];
        local_c8[uVar22] = dVar23;
      }
      uVar22 = uVar19;
      puVar7 = puVar17;
    } while (uVar13 < uVar19);
    pdVar20 = pdVar15;
    uVar22 = uVar13;
    do {
      if (ABS(y[uVar13 + (long)((int)uVar13 * 4) + -1]) < 1e-16) {
        bVar12 = false;
        goto LAB_002b1287;
      }
      uVar22 = uVar22 + 1;
      dVar23 = -y[uVar13 + uVar22 * 4 + -1] / y[uVar13 + (long)((int)uVar13 * 4) + -1];
      lVar18 = 0;
      do {
        dVar4 = (pdVar14 + lVar18)[1];
        dVar1 = (pdVar20 + lVar18)[1];
        pdVar20[lVar18] = pdVar14[lVar18] * dVar23 + pdVar20[lVar18];
        (pdVar20 + lVar18)[1] = dVar4 * dVar23 + dVar1;
        lVar18 = lVar18 + 2;
      } while (lVar18 != 4);
      local_c8[uVar22] = dVar23 * local_c8[uVar13] + local_c8[uVar22];
      pdVar20 = pdVar20 + 4;
    } while (uVar22 != 3);
    uVar13 = uVar13 + 1;
    pdVar15 = pdVar15 + 4;
    pdVar14 = pdVar14 + 4;
  } while (uVar13 != 3);
  pdVar14 = params + 4;
  lVar18 = 0;
  uVar13 = 4;
  do {
    uVar22 = uVar13 - 1;
    dVar23 = ABS(y[uVar22 * 5 + -1]);
    bVar12 = 1e-16 <= dVar23;
    if (dVar23 < 1e-16) break;
    dVar23 = 0.0;
    if (uVar13 < 4) {
      lVar21 = 0;
      do {
        dVar23 = dVar23 + *(double *)(puVar16 + lVar21 * 8) * pdVar14[lVar21];
        lVar21 = lVar21 + 1;
      } while (lVar18 != lVar21);
    }
    params[uVar22] = (local_c8[uVar22] - dVar23) / y[uVar22 * 5 + -1];
    lVar18 = lVar18 + 1;
    pdVar14 = pdVar14 + -1;
    puVar16 = puVar16 + -0x28;
    bVar6 = 1 < uVar13;
    uVar13 = uVar22;
  } while (bVar6);
LAB_002b1287:
  if (bVar12 != false) {
    params[4] = -params[3];
    params[5] = params[2];
  }
  return bVar12;
}

Assistant:

static bool find_rotzoom(const Correspondence *points, const int *indices,
                         int num_indices, double *params) {
  const int n = 4;    // Size of least-squares problem
  double mat[4 * 4];  // Accumulator for A'A
  double y[4];        // Accumulator for A'b
  double a[4];        // Single row of A
  double b;           // Single element of b

  least_squares_init(mat, y, n);
  for (int i = 0; i < num_indices; ++i) {
    int index = indices[i];
    const double sx = points[index].x;
    const double sy = points[index].y;
    const double dx = points[index].rx;
    const double dy = points[index].ry;

    a[0] = 1;
    a[1] = 0;
    a[2] = sx;
    a[3] = sy;
    b = dx;
    least_squares_accumulate(mat, y, a, b, n);

    a[0] = 0;
    a[1] = 1;
    a[2] = sy;
    a[3] = -sx;
    b = dy;
    least_squares_accumulate(mat, y, a, b, n);
  }

  // Fill in params[0] .. params[3] with output model
  if (!least_squares_solve(mat, y, params, n)) {
    return false;
  }

  // Fill in remaining parameters
  params[4] = -params[3];
  params[5] = params[2];

  return true;
}